

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::QueueSharedDependencies
          (cmComputeLinkDepends *this,size_t depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps)

{
  pointer pcVar1;
  pointer pcVar2;
  SharedDepEntry qe;
  value_type vStack_98;
  
  pcVar1 = (deps->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar2 = (deps->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    cmLinkItem::cmLinkItem(&vStack_98.Item);
    cmLinkItem::operator=(&vStack_98.Item,pcVar2);
    vStack_98.DependerIndex = depender_index;
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::push_back(&(this->SharedDepQueue).c,&vStack_98);
    cmLinkItem::~cmLinkItem(&vStack_98.Item);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::QueueSharedDependencies(
  size_t depender_index, std::vector<cmLinkItem> const& deps)
{
  for (cmLinkItem const& li : deps) {
    SharedDepEntry qe;
    qe.Item = li;
    qe.DependerIndex = depender_index;
    this->SharedDepQueue.push(qe);
  }
}